

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

CURLcode Curl_http_write_resp_hds(Curl_easy *data,char *buf,size_t blen,size_t *pconsumed)

{
  dynbuf *s;
  undefined1 *puVar1;
  connectdata *conn;
  CURLcode CVar2;
  statusline sVar3;
  uint uVar4;
  void *pvVar5;
  char *pcVar6;
  size_t len;
  bool bVar7;
  size_t sVar8;
  size_t local_38;
  
  if (((data->req).field_0xd1 & 1) == 0) {
    *pconsumed = 0;
    CVar2 = CURLE_OK;
  }
  else {
    conn = data->conn;
    *pconsumed = 0;
    s = &(data->state).headerb;
    do {
      if ((blen == 0) || (((data->req).field_0xd1 & 1) == 0)) {
LAB_00136c4f:
        bVar7 = false;
LAB_00136c51:
        uVar4 = *(uint *)&(data->req).field_0xd1;
        if ((uVar4 & 1) == 0 && !bVar7) {
          Curl_dyn_free(s);
          uVar4 = *(uint *)&(data->req).field_0xd1;
        }
        if ((uVar4 & 1) != 0) {
          return CURLE_OK;
        }
        CVar2 = CURLE_OK;
        if (((uVar4 >> 0x11 & 1) == 0) && (sVar8 = Curl_dyn_len(s), sVar8 != 0)) {
          pcVar6 = Curl_dyn_ptr(s);
          sVar8 = Curl_dyn_len(s);
          CVar2 = Curl_client_write(data,1,pcVar6,sVar8);
        }
        Curl_dyn_free(s);
        return CVar2;
      }
      pvVar5 = memchr(buf,10,blen);
      if (pvVar5 == (void *)0x0) {
        CVar2 = Curl_dyn_addn(s,buf,blen);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
        *pconsumed = *pconsumed + blen;
        if ((data->req).headerline == 0) {
          pcVar6 = Curl_dyn_ptr(s);
          sVar8 = Curl_dyn_len(s);
          sVar3 = checkprotoprefix(data,conn,pcVar6,sVar8);
          if (sVar3 == STATUS_BAD) {
            puVar1 = &(data->req).field_0xd1;
            *puVar1 = *puVar1 & 0xfe;
            Curl_conncontrol(conn,2);
            CVar2 = CURLE_WEIRD_SERVER_REPLY;
            pcVar6 = "Invalid status line";
            if ((9 < (data->req).httpversion) || (((ulong)conn->bits & 0x40) != 0))
            goto LAB_00136cfc;
            if (((data->state).http_neg.field_0x3 & 4) != 0) goto LAB_00136d1e;
            goto LAB_00136cf2;
          }
        }
        goto LAB_00136c4f;
      }
      sVar8 = (long)pvVar5 + (1 - (long)buf);
      local_38 = sVar8;
      CVar2 = Curl_dyn_addn(s,buf,sVar8);
      if (CVar2 != CURLE_OK) {
        return CVar2;
      }
      *pconsumed = *pconsumed + sVar8;
      if ((data->req).headerline == 0) {
        pcVar6 = Curl_dyn_ptr(s);
        len = Curl_dyn_len(s);
        sVar3 = checkprotoprefix(data,conn,pcVar6,len);
        if (sVar3 == STATUS_BAD) {
          Curl_conncontrol(conn,2);
          CVar2 = CURLE_WEIRD_SERVER_REPLY;
          pcVar6 = "Invalid status line";
          if ((9 < (data->req).httpversion) || (((ulong)conn->bits & 0x40) != 0)) goto LAB_00136cfc;
          if (((data->state).http_neg.field_0x3 & 4) != 0) {
            puVar1 = &(data->req).field_0xd1;
            *puVar1 = *puVar1 & 0xfe;
LAB_00136d1e:
            bVar7 = true;
            goto LAB_00136c51;
          }
LAB_00136cf2:
          CVar2 = CURLE_UNSUPPORTED_PROTOCOL;
          pcVar6 = "Received HTTP/0.9 when not allowed";
LAB_00136cfc:
          Curl_failf(data,pcVar6);
          return CVar2;
        }
      }
      blen = blen - sVar8;
      buf = buf + sVar8;
      pcVar6 = Curl_dyn_ptr(s);
      sVar8 = Curl_dyn_len(s);
      CVar2 = http_rw_hd(data,pcVar6,sVar8,buf,blen,&local_38);
      Curl_dyn_reset(s);
      if (local_38 != 0) {
        blen = blen - local_38;
        buf = buf + local_38;
        *pconsumed = *pconsumed + local_38;
      }
    } while (CVar2 == CURLE_OK);
  }
  return CVar2;
}

Assistant:

CURLcode Curl_http_write_resp_hds(struct Curl_easy *data,
                                  const char *buf, size_t blen,
                                  size_t *pconsumed)
{
  if(!data->req.header) {
    *pconsumed = 0;
    return CURLE_OK;
  }
  else {
    CURLcode result;

    result = http_parse_headers(data, buf, blen, pconsumed);
    if(!result && !data->req.header) {
      if(!data->req.no_body && Curl_dyn_len(&data->state.headerb)) {
        /* leftover from parsing something that turned out not
         * to be a header, only happens if we allow for
         * HTTP/0.9 like responses */
        result = Curl_client_write(data, CLIENTWRITE_BODY,
                                   Curl_dyn_ptr(&data->state.headerb),
                                   Curl_dyn_len(&data->state.headerb));
      }
      Curl_dyn_free(&data->state.headerb);
    }
    return result;
  }
}